

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_61a88::FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test
::TestBody(FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30.ss_.ptr_._0_1_ = 0x20;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x20);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            (local_20,"FieldTypeEnum::UNRECOGNISED",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED)",
             (FieldTypeEnum *)&local_30,(FieldTypeEnum *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x23,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType)
{
    ASSERT_EQ(FieldTypeEnum::UNRECOGNISED, FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED));
}